

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

ngx_int_t ngx_get_full_name(ngx_pool_t *pool,ngx_str_t *prefix,ngx_str_t *name)

{
  size_t __n;
  u_char *__dest;
  
  if (*name->data != '/') {
    __n = prefix->len;
    __dest = (u_char *)ngx_pnalloc(pool,__n + name->len + 1);
    if (__dest == (u_char *)0x0) {
      return -1;
    }
    memcpy(__dest,prefix->data,__n);
    ngx_cpystrn(__dest + __n,name->data,name->len + 1);
    name->len = name->len + __n;
    name->data = __dest;
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_get_full_name(ngx_pool_t *pool, ngx_str_t *prefix, ngx_str_t *name)
{
    size_t      len;
    u_char     *p, *n;
    ngx_int_t   rc;

    rc = ngx_test_full_name(name);

    if (rc == NGX_OK) {
        return rc;
    }

    len = prefix->len;

#if (NGX_WIN32)

    if (rc == 2) {
        len = rc;
    }

#endif

    n = ngx_pnalloc(pool, len + name->len + 1);
    if (n == NULL) {
        return NGX_ERROR;
    }

    p = ngx_cpymem(n, prefix->data, len);
    ngx_cpystrn(p, name->data, name->len + 1);

    name->len += len;
    name->data = n;

    return NGX_OK;
}